

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O1

void __thiscall
chaiscript::ChaiScript_Basic::load_module
          (ChaiScript_Basic *this,string *t_module_name,string *t_filename)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
  *this_00;
  int iVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  Loadable_Module *this_01;
  Loadable_Module_Ptr lm;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_use_mutex);
  if (iVar1 == 0) {
    this_00 = &this->m_loaded_modules;
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
            ::find(&this_00->_M_t,t_module_name);
    if ((_Rb_tree_header *)cVar2._M_node ==
        &(this->m_loaded_modules)._M_t._M_impl.super__Rb_tree_header) {
      this_01 = (Loadable_Module *)operator_new(0x20);
      detail::Loadable_Module::Loadable_Module(this_01,t_module_name,t_filename);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chaiscript::detail::Loadable_Module*>(&local_38,this_01);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
               ::operator[](this_00,t_module_name);
      (pmVar4->super___shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar4->
                  super___shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&local_38);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_active_loaded_modules,t_module_name);
      Module::apply<chaiscript::ChaiScript_Basic,chaiscript::detail::Dispatch_Engine>
                ((this_01->m_moduleptr).
                 super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this,
                 &this->m_engine);
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
    }
    else {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->m_active_loaded_modules)._M_t,t_module_name);
      if ((_Rb_tree_header *)cVar3._M_node ==
          &(this->m_active_loaded_modules)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&this->m_active_loaded_modules,t_module_name);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
                 ::operator[](this_00,t_module_name);
        Module::apply<chaiscript::ChaiScript_Basic,chaiscript::detail::Dispatch_Engine>
                  ((((pmVar4->
                     super___shared_ptr<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->m_moduleptr).
                   super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this,
                   &this->m_engine);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_use_mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void load_module(const std::string &t_module_name, const std::string &t_filename) {
      chaiscript::detail::threading::lock_guard<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);

      if (m_loaded_modules.count(t_module_name) == 0) {
        detail::Loadable_Module_Ptr lm(new detail::Loadable_Module(t_module_name, t_filename));
        m_loaded_modules[t_module_name] = lm;
        m_active_loaded_modules.insert(t_module_name);
        add(lm->m_moduleptr);
      } else if (m_active_loaded_modules.count(t_module_name) == 0) {
        m_active_loaded_modules.insert(t_module_name);
        add(m_loaded_modules[t_module_name]->m_moduleptr);
      }
    }